

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O2

SockAddr * AGSSock::SockAddr_CreateIP(char *ip,ags_t port)

{
  SockAddr *sa;
  
  sa = SockAddr_Create(2);
  SockAddr_set_IP(sa,ip);
  if (((sa->super_sockaddr_storage).ss_family | 8) == 10) {
    *(ushort *)(sa->super_sockaddr_storage).__ss_padding = (ushort)port << 8 | (ushort)port >> 8;
  }
  return sa;
}

Assistant:

SockAddr *SockAddr_CreateIP(const char *ip, ags_t port)
{
	SockAddr *addr = SockAddr_Create(AF_INET);
	SockAddr_set_IP(addr, ip);
	SockAddr_set_Port(addr, port);
	return addr;
}